

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  float *pfVar4;
  int *piVar5;
  ulong uVar6;
  void *pvVar7;
  long *in_RSI;
  long in_RDI;
  Mat dst_1;
  Mat src_1;
  int q_3;
  float *beta_1;
  float *alpha_1;
  int *yofs_1;
  int *xofs_1;
  int *buf_1;
  Mat dst;
  Mat src;
  int q_2;
  float *beta;
  float *alpha;
  int *yofs;
  int *xofs;
  int *buf;
  int in_x;
  int x;
  int in_y;
  int y;
  float *output_ptr;
  float *ptr_1;
  int q_1;
  float *ptr;
  Mat top_blob_c;
  int q;
  int ow;
  int oh;
  size_t elemsize;
  int c;
  int w;
  int h;
  Mat *in_stack_fffffffffffffd10;
  Mat *in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  int *in_stack_fffffffffffffd28;
  Mat *this_00;
  Mat *in_stack_fffffffffffffd30;
  int local_234;
  int local_184;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  int iVar8;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  int iVar9;
  undefined4 in_stack_fffffffffffffec4;
  int iVar10;
  Mat *in_stack_fffffffffffffec8;
  Mat *in_stack_fffffffffffffed0;
  Mat local_f0;
  float *local_b0;
  int local_a8;
  long local_98;
  int local_4c;
  uint local_48;
  uint local_44;
  long local_40;
  int local_34;
  uint local_30;
  uint local_2c;
  long *local_18;
  int local_4;
  
  local_2c = *(uint *)(in_RSI + 6);
  local_30 = *(uint *)((long)in_RSI + 0x2c);
  local_34 = *(int *)((long)in_RSI + 0x34);
  local_40 = in_RSI[2];
  local_44 = *(uint *)(in_RDI + 0x90);
  local_48 = *(uint *)(in_RDI + 0x8c);
  if ((int)in_RSI[5] == 1) {
    local_2c = 1;
    local_30 = 1;
    local_34 = *(int *)((long)in_RSI + 0x2c);
  }
  if ((local_44 == 0) || (local_48 == 0)) {
    local_44 = (uint)((float)(int)local_2c * *(float *)(in_RDI + 0x88));
    local_48 = (uint)((float)(int)local_30 * *(float *)(in_RDI + 0x84));
  }
  if ((local_44 == local_2c) && (local_48 == local_30)) {
    Mat::operator=(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    Mat::create(in_stack_fffffffffffffd30,(int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                (int)in_stack_fffffffffffffd28,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                (size_t)in_stack_fffffffffffffd18,(Allocator *)in_stack_fffffffffffffd10);
    bVar3 = Mat::empty(in_stack_fffffffffffffd10);
    if (bVar3) {
      local_4 = -100;
    }
    else if ((int)local_18[5] == 1) {
      for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        local_98 = *local_18 + (long)local_4c * 4;
        Mat::fill(in_stack_fffffffffffffd20,(float)((ulong)in_stack_fffffffffffffd18 >> 0x20));
        Mat::~Mat((Mat *)0x19b623);
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x80) == 1) {
      for (local_a8 = 0; local_a8 < local_34; local_a8 = local_a8 + 1) {
        this_00 = &local_f0;
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(this_00);
        Mat::~Mat((Mat *)0x19b6df);
        in_stack_fffffffffffffd18 = (Mat *)&stack0xfffffffffffffec8;
        local_b0 = pfVar4;
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        pfVar4 = Mat::operator_cast_to_float_(in_stack_fffffffffffffd18);
        Mat::~Mat((Mat *)0x19b72b);
        for (iVar10 = 0; iVar10 < (int)local_44; iVar10 = iVar10 + 1) {
          piVar5 = std::min<int>((int *)&stack0xfffffffffffffebc,(int *)&stack0xfffffffffffffeb8);
          iVar9 = *piVar5;
          for (iVar8 = 0; iVar8 < (int)local_48; iVar8 = iVar8 + 1) {
            piVar5 = std::min<int>((int *)&stack0xfffffffffffffeac,(int *)&stack0xfffffffffffffea8);
            pfVar4[(int)(local_48 * iVar10 + iVar8)] = local_b0[(int)(iVar9 * local_30 + *piVar5)];
          }
        }
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x80) == 2) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)(local_48 * 3 + local_44 * 3);
      uVar6 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar6);
      linear_coeffs((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(int)in_stack_fffffffffffffd30,
                    in_stack_fffffffffffffd28,(float *)in_stack_fffffffffffffd20);
      linear_coeffs((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(int)in_stack_fffffffffffffd30,
                    in_stack_fffffffffffffd28,(float *)in_stack_fffffffffffffd20);
      for (local_184 = 0; local_184 < local_34; local_184 = local_184 + 1) {
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        resize_bilinear_image
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   (float *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (float *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        Mat::~Mat((Mat *)0x19bae6);
        Mat::~Mat((Mat *)0x19baf3);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      local_4 = 0;
    }
    else if (*(int *)(in_RDI + 0x80) == 3) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(int)(local_48 * 5 + local_44 * 5);
      uVar6 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pvVar7 = operator_new__(uVar6);
      cubic_coeffs((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(int)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28,(float *)in_stack_fffffffffffffd20);
      cubic_coeffs((int)((ulong)in_stack_fffffffffffffd30 >> 0x20),(int)in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd28,(float *)in_stack_fffffffffffffd20);
      for (local_234 = 0; local_234 < local_34; local_234 = local_234 + 1) {
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        Mat::channel(in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20));
        resize_bicubic_image
                  ((Mat *)src_1.data,(Mat *)dst_1.cstep,(float *)dst_1._48_8_,(int *)dst_1._40_8_,
                   (float *)dst_1.allocator,(int *)dst_1._24_8_);
        Mat::~Mat((Mat *)0x19bd5b);
        Mat::~Mat((Mat *)0x19bd68);
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete__(pvVar7);
      }
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)*(uint *)(in_RDI + 0x80),
              (ulong)local_44,(ulong)local_48);
      local_4 = -0xe9;
    }
  }
  return local_4;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)// nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        int* buf = new int[ow + oh + ow*2 + oh*2];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 2];
        float* beta = (float*)(buf + ow + oh + ow*2);//new float[oh * 2];

        linear_coeffs(w, ow, xofs, alpha);
        linear_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bilinear_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else if (resize_type == 3)// bicubic
    {
        int* buf = new int[ow + oh + ow*4 + oh*4];

        int* xofs = buf;//new int[ow];
        int* yofs = buf + ow;//new int[oh];

        float* alpha = (float*)(buf + ow + oh);//new float[ow * 4];
        float* beta = (float*)(buf + ow + oh + ow*4);//new float[oh * 4];

        cubic_coeffs(w, ow, xofs, alpha);
        cubic_coeffs(h, oh, yofs, beta);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const Mat src = bottom_blob.channel(q);
            Mat dst = top_blob.channel(q);

            resize_bicubic_image(src, dst, alpha, xofs, beta, yofs);
        }

        delete[] buf;

        return 0;
    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}